

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O3

void __thiscall
highwayhash::DurationsForInputs::AddSample(DurationsForInputs *this,FuncInput input,float sample)

{
  float **ppfVar1;
  size_t sVar2;
  
  sVar2 = this->num_items;
  if (sVar2 != 0) {
    ppfVar1 = &this->items->durations;
    do {
      if (((Item *)(ppfVar1 + -2))->input == input) {
        sVar2 = (size_t)ppfVar1[-1];
        (*ppfVar1)[sVar2] = sample;
        ppfVar1[-1] = (float *)(sVar2 + 1);
        return;
      }
      ppfVar1 = ppfVar1 + 3;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

void DurationsForInputs::AddSample(const FuncInput input, const float sample) {
  for (size_t i = 0; i < num_items; ++i) {
    Item& item = items[i];
    if (item.input == input) {
      item.durations[item.num_durations] = sample;
      ++item.num_durations;
      return;
    }
  }
  NANOBENCHMARK_CHECK(!"Item not found");
}